

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool anon_unknown.dwarf_13fc48::hufDecode
               (longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,unsigned_short *out)

{
  unsigned_short uVar1;
  undefined8 uVar2;
  int *piVar3;
  unsigned_short *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  unsigned_short *puVar8;
  longlong lVar9;
  ulong uVar10;
  byte local_99;
  int iStack_98;
  unsigned_short s_2;
  uchar cs_2;
  HufDec pl_1;
  byte local_7d;
  int i;
  unsigned_short s_1;
  uchar cs_1;
  int l;
  int j;
  unsigned_short s;
  uchar cs;
  HufDec pl;
  char *ie;
  unsigned_short *oe;
  unsigned_short *outb;
  ulong uStack_40;
  int lc;
  longlong c;
  int no_local;
  int rlc_local;
  int ni_local;
  char *in_local;
  HufDec *hdecod_local;
  longlong *hcode_local;
  
  puVar4 = out;
  uStack_40 = 0;
  outb._4_4_ = 0;
  puVar8 = out + no;
  _rlc_local = (byte *)in;
  do {
    if (in + (ni + 7) / 8 <= _rlc_local) {
      uVar7 = 8U - ni & 7;
      uStack_40 = (long)uStack_40 >> (sbyte)uVar7;
      outb._4_4_ = outb._4_4_ - uVar7;
      while( true ) {
        if (outb._4_4_ < 1) {
          return (long)out - (long)puVar4 >> 1 == (long)no;
        }
        uVar2 = *(undefined8 *)(hdecod + (uStack_40 << (0xeU - (char)outb._4_4_ & 0x3f) & 0x3fff));
        iStack_98 = (int)uVar2;
        if ((char)uVar2 == '\0') break;
        outb._4_4_ = outb._4_4_ - (char)uVar2;
        if (iStack_98 >> 8 == rlc) {
          if (outb._4_4_ < 8) {
            uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
            outb._4_4_ = outb._4_4_ + 8;
            _rlc_local = _rlc_local + 1;
          }
          outb._4_4_ = outb._4_4_ + -8;
          local_99 = (byte)((long)uStack_40 >> ((byte)outb._4_4_ & 0x3f));
          if (puVar8 < out + (int)(uint)local_99) {
            return false;
          }
          uVar1 = out[-1];
          while (local_99 != 0) {
            *out = uVar1;
            out = out + 1;
            local_99 = local_99 - 1;
          }
        }
        else {
          if (puVar8 <= out) {
            return false;
          }
          *out = (unsigned_short)((ulong)uVar2 >> 8);
          out = out + 1;
        }
      }
      return false;
    }
    uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
    outb._4_4_ = outb._4_4_ + 8;
    _rlc_local = _rlc_local + 1;
    while (0xd < outb._4_4_) {
      uVar2 = *(undefined8 *)
               (hdecod + ((long)uStack_40 >> ((char)outb._4_4_ - 0xeU & 0x3f) & 0x3fff));
      piVar3 = hdecod[(long)uStack_40 >> ((char)outb._4_4_ - 0xeU & 0x3f) & 0x3fff].p;
      j = (int)uVar2;
      iVar5 = j >> 8;
      if ((char)uVar2 == '\0') {
        if (piVar3 == (int *)0x0) {
          return false;
        }
        for (_s_1 = 0; _s_1 < iVar5; _s_1 = _s_1 + 1) {
          lVar9 = hufLength(hcode[piVar3[_s_1]]);
          iVar6 = (int)lVar9;
          for (; outb._4_4_ < iVar6 && _rlc_local < in + (ni + 7) / 8; outb._4_4_ = outb._4_4_ + 8)
          {
            uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
            _rlc_local = _rlc_local + 1;
          }
          if ((iVar6 <= outb._4_4_) &&
             (uVar10 = hufCode(hcode[piVar3[_s_1]]),
             uVar10 == ((long)uStack_40 >> ((char)outb._4_4_ - (byte)lVar9 & 0x3f) &
                       (1L << ((byte)lVar9 & 0x3f)) - 1U))) {
            outb._4_4_ = outb._4_4_ - iVar6;
            if (piVar3[_s_1] == rlc) {
              if (outb._4_4_ < 8) {
                uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
                outb._4_4_ = outb._4_4_ + 8;
                _rlc_local = _rlc_local + 1;
              }
              outb._4_4_ = outb._4_4_ + -8;
              local_7d = (byte)((long)uStack_40 >> ((byte)outb._4_4_ & 0x3f));
              if (puVar8 < out + (int)(uint)local_7d) {
                return false;
              }
              uVar1 = out[-1];
              while (local_7d != 0) {
                *out = uVar1;
                out = out + 1;
                local_7d = local_7d - 1;
              }
            }
            else {
              if (puVar8 <= out) {
                return false;
              }
              *out = (unsigned_short)piVar3[_s_1];
              out = out + 1;
            }
            break;
          }
        }
        if (_s_1 == iVar5) {
          return false;
        }
      }
      else {
        outb._4_4_ = outb._4_4_ - (char)uVar2;
        if (iVar5 == rlc) {
          if (outb._4_4_ < 8) {
            uStack_40 = uStack_40 << 8 | (ulong)*_rlc_local;
            outb._4_4_ = outb._4_4_ + 8;
            _rlc_local = _rlc_local + 1;
          }
          outb._4_4_ = outb._4_4_ + -8;
          l._3_1_ = (byte)((long)uStack_40 >> ((byte)outb._4_4_ & 0x3f));
          if (puVar8 < out + (int)(uint)l._3_1_) {
            return false;
          }
          uVar1 = out[-1];
          while (l._3_1_ != 0) {
            *out = uVar1;
            out = out + 1;
            l._3_1_ = l._3_1_ - 1;
          }
        }
        else {
          if (puVar8 <= out) {
            return false;
          }
          *out = (unsigned_short)((ulong)uVar2 >> 8);
          out = out + 1;
        }
      }
    }
  } while( true );
}

Assistant:

bool hufDecode(const long long *hcode, // i : encoding table
               const HufDec *hdecod,   // i : decoding table
               const char *in,         // i : compressed input buffer
               int ni,                 // i : input size (in bits)
               int rlc,                // i : run-length code
               int no,                 // i : expected output size (in bytes)
               unsigned short *out)    //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;
  unsigned short *oe = out + no;
  const char *ie = in + (ni + 7) / 8; // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        getCode(pl.lit, rlc, c, lc, in, out, oe);
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie) // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              getCode(pl.p[j], rlc, c, lc, in, out, oe);
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      getCode(pl.lit, rlc, c, lc, in, out, oe);
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}